

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mel_filter_bank_analysis.cc
# Opt level: O0

bool __thiscall
sptk::MelFilterBankAnalysis::Run
          (MelFilterBankAnalysis *this,vector<double,_std::allocator<double>_> *power_spectrum,
          vector<double,_std::allocator<double>_> *filter_bank_output,double *energy)

{
  int iVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  reference pvVar6;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var8;
  double *in_RCX;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double dVar9;
  double sum;
  int m_1;
  double x;
  int m;
  int k;
  double *output;
  double *input;
  double *w;
  int *map;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff38;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  int local_74;
  int local_64;
  
  if ((((*(byte *)((long)in_RDI._M_current + 0x19) & 1) != 0) &&
      (__last._M_current = (double *)std::vector<double,_std::allocator<double>_>::size(in_RSI),
      __last._M_current == (double *)(long)(*(int *)(in_RDI._M_current + 1) / 2 + 1))) &&
     (in_RDX != (vector<double,_std::allocator<double>_> *)0x0)) {
    sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (sVar2 != (long)*(int *)((long)in_RDI._M_current + 0xc)) {
      std::vector<double,_std::allocator<double>_>::resize
                (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
    std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
    std::
    fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
              (in_RDI,__last,(double *)in_stack_ffffffffffffff40);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI._M_current + 8),0);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI._M_current + 0xb),0);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
    for (local_64 = *(int *)((long)in_RDI._M_current + 0x1c);
        local_64 < *(int *)(in_RDI._M_current + 4); local_64 = local_64 + 1) {
      iVar1 = pvVar3[local_64];
      if (((ulong)in_RDI._M_current[3] & 1) == 0) {
        in_stack_ffffffffffffff40 =
             (vector<double,_std::allocator<double>_> *)sqrt(pvVar5[local_64]);
      }
      else {
        in_stack_ffffffffffffff40 = (vector<double,_std::allocator<double>_> *)pvVar5[local_64];
      }
      if (0 < iVar1) {
        pvVar6[iVar1 + -1] =
             (double)in_stack_ffffffffffffff40 * pvVar4[local_64] + pvVar6[iVar1 + -1];
      }
      if (iVar1 < *(int *)((long)in_RDI._M_current + 0xc)) {
        pvVar6[iVar1] = (double)in_stack_ffffffffffffff40 * (1.0 - pvVar4[local_64]) + pvVar6[iVar1]
        ;
      }
    }
    for (local_74 = 0; local_74 < *(int *)((long)in_RDI._M_current + 0xc); local_74 = local_74 + 1)
    {
      if (pvVar6[local_74] < in_RDI._M_current[2]) {
        pvVar6[local_74] = in_RDI._M_current[2];
      }
      dVar9 = log(pvVar6[local_74]);
      pvVar6[local_74] = dVar9;
    }
    if (in_RCX != (double *)0x0) {
      std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff38);
      _Var7 = __gnu_cxx::
              __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
              operator+(__last._M_current,(difference_type)in_stack_ffffffffffffff40);
      std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff38);
      _Var8 = __gnu_cxx::
              __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
              operator-(__last._M_current,(difference_type)in_stack_ffffffffffffff40);
      std::vector<double,_std::allocator<double>_>::front(in_stack_ffffffffffffff40);
      std::vector<double,_std::allocator<double>_>::back(in_stack_ffffffffffffff40);
      dVar9 = std::
              accumulate<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,double,sptk::MelFilterBankAnalysis::Run(std::vector<double,std::allocator<double>>const&,std::vector<double,std::allocator<double>>*,double*)const::__0>
                        (_Var7._M_current,_Var8._M_current);
      dVar9 = log(dVar9 / (double)*(int *)(in_RDI._M_current + 1));
      *in_RCX = dVar9;
    }
    return true;
  }
  return false;
}

Assistant:

bool MelFilterBankAnalysis::Run(const std::vector<double>& power_spectrum,
                                std::vector<double>* filter_bank_output,
                                double* energy) const {
  // Check inputs.
  if (!is_valid_ ||
      power_spectrum.size() != static_cast<std::size_t>(fft_length_ / 2 + 1) ||
      NULL == filter_bank_output) {
    return false;
  }

  // Prepare memories.
  if (filter_bank_output->size() != static_cast<std::size_t>(num_channel_)) {
    filter_bank_output->resize(num_channel_);
  }

  std::fill(filter_bank_output->begin(), filter_bank_output->end(), 0.0);

  // Apply mel-filter-banks.
  const int* map(&(channel_indices_[0]));
  const double* w(&(channel_weights_[0]));
  const double* input(&(power_spectrum[0]));
  double* output(&((*filter_bank_output)[0]));
  for (int k(lower_bin_index_); k < upper_bin_index_; ++k) {
    const int m(map[k]);
    const double x(use_power_ ? input[k] : std::sqrt(input[k]));
    if (0 < m) {
      output[m - 1] += x * w[k];
    }
    if (m < num_channel_) {
      output[m] += x * (1.0 - w[k]);
    }
  }

  // Apply logarithm function.
  for (int m(0); m < num_channel_; ++m) {
    if (output[m] < floor_) output[m] = floor_;
    output[m] = std::log(output[m]);
  }

  if (NULL != energy) {
    const double sum(
        std::accumulate(power_spectrum.begin() + 1, power_spectrum.end() - 1,
                        power_spectrum.front() + power_spectrum.back(),
                        [](double a, double x) { return a + 2.0 * x; }));
    *energy = std::log(sum / fft_length_);
  }

  return true;
}